

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O3

bool __thiscall
miniros::PollSet::addSocket
          (PollSet *this,int fd,SocketUpdateFunc *update_func,TransportPtr *transport)

{
  mutex *__mutex;
  SocketUpdateFunc *this_00;
  int iVar1;
  __sighandler_t __handler;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>,_bool> pVar2;
  int fd_local;
  pair<int,_miniros::PollSet::SocketInfo> local_98;
  SocketInfo local_58;
  
  local_58.func_.super__Function_base._M_functor._8_8_ = 0;
  local_58.func_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.transport_.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_58.func_._M_invoker = (_Invoker_type)0x0;
  local_58.events_ = 0;
  local_58.transport_.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (transport->super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fd_local = fd;
  local_58.fd_ = fd;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_58.transport_.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(transport->super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  this_00 = &local_58.func_;
  std::function<void_(int)>::operator=(this_00,update_func);
  __mutex = &this->socket_info_mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    std::pair<int,_miniros::PollSet::SocketInfo>::pair<int_&,_miniros::PollSet::SocketInfo_&,_true>
              (&local_98,&fd_local,&local_58);
    pVar2 = std::
            _Rb_tree<int,std::pair<int_const,miniros::PollSet::SocketInfo>,std::_Select1st<std::pair<int_const,miniros::PollSet::SocketInfo>>,std::less<int>,std::allocator<std::pair<int_const,miniros::PollSet::SocketInfo>>>
            ::_M_emplace_unique<std::pair<int,miniros::PollSet::SocketInfo>>
                      ((_Rb_tree<int,std::pair<int_const,miniros::PollSet::SocketInfo>,std::_Select1st<std::pair<int_const,miniros::PollSet::SocketInfo>>,std::less<int>,std::allocator<std::pair<int_const,miniros::PollSet::SocketInfo>>>
                        *)this,&local_98);
    if (local_98.second.func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.second.func_.super__Function_base._M_manager)
                ((_Any_data *)((long)&local_98 + 0x18U),(_Any_data *)((long)&local_98 + 0x18U),
                 __destroy_functor);
    }
    if (local_98.second.transport_.
        super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.second.transport_.
                 super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (addSocket::loc.initialized_ == false) {
        local_98._0_8_ = (long)&local_98 + 0x10U;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"miniros.poll_set","");
        console::initializeLogLocation(&addSocket::loc,(string *)&local_98,Debug);
        if (local_98._0_8_ != (long)&local_98 + 0x10U) {
          operator_delete((void *)local_98._0_8_,
                          (ulong)((long)local_98.second.transport_.
                                        super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi + 1));
        }
      }
      if (addSocket::loc.level_ != Debug) {
        console::setLogLocationLevel(&addSocket::loc,Debug);
        console::checkLogLocationEnabled(&addSocket::loc);
      }
      if (addSocket::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,addSocket::loc.logger_,addSocket::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                       ,0x52,
                       "bool miniros::PollSet::addSocket(int, const SocketUpdateFunc &, const TransportPtr &)"
                       ,"PollSet: Tried to add duplicate fd [%d]",(ulong)(uint)fd_local);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      iVar1 = fd_local;
      add_socket_to_watcher(this->epfd_,fd_local);
      this->sockets_changed_ = true;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      signal(this,iVar1,__handler);
    }
    if (local_58.func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_58.func_.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
    if (local_58.transport_.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.transport_.
                 super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return (bool)(pVar2.second & 1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool PollSet::addSocket(int fd, const SocketUpdateFunc& update_func, const TransportPtr& transport)
{
  SocketInfo info;
  info.fd_ = fd;
  info.events_ = 0;
  info.transport_ = transport;
  info.func_ = update_func;

  {
    std::scoped_lock<std::mutex> lock(socket_info_mutex_);

    bool b = socket_info_.insert(std::make_pair(fd, info)).second;
    if (!b)
    {
      MINIROS_DEBUG("PollSet: Tried to add duplicate fd [%d]", fd);
      return false;
    }

    add_socket_to_watcher(epfd_, fd);

    sockets_changed_ = true;
  }

  signal();

  return true;
}